

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

Stmt * __thiscall
kratos::MultipleDriverVisitor::non_gen_root_parent(MultipleDriverVisitor *this,Stmt *stmt)

{
  int iVar1;
  IRNodeKind IVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint uVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  bool bVar4;
  undefined1 auVar5 [16];
  string_view format_str;
  format_args args;
  string local_b0;
  uint local_8c;
  Stmt *pSStack_88;
  uint32_t count;
  IRNode *parent;
  Stmt *stmt_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_70;
  basic_string_view<char> local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_58;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_48;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *vargs;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_8c = 0;
  pSStack_88 = (Stmt *)this;
  parent = (IRNode *)this;
  while( true ) {
    iVar1 = (*(pSStack_88->super_IRNode)._vptr_IRNode[4])();
    bVar4 = false;
    if (CONCAT44(extraout_var,iVar1) != 0) {
      iVar1 = (*(pSStack_88->super_IRNode)._vptr_IRNode[4])();
      IVar2 = IRNode::ir_node_kind((IRNode *)CONCAT44(extraout_var_00,iVar1));
      bVar4 = IVar2 == StmtKind;
    }
    if (!bVar4) break;
    iVar1 = (*(pSStack_88->super_IRNode)._vptr_IRNode[4])();
    pSStack_88 = (Stmt *)CONCAT44(extraout_var_01,iVar1);
    uVar3 = local_8c + 1;
    bVar4 = 10000 < local_8c;
    local_8c = uVar3;
    if (bVar4) {
      auVar5 = __cxa_allocate_exception(0x10);
      local_38 = &local_b0;
      vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               *)anon_var_dwarf_60a90e;
      local_58.named_args.data =
           (named_arg_info<char> *)
           fmt::v7::make_args_checked<,char[36],char>
                     ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                       *)"Unable to find parent for statement",(v7 *)stmt,auVar5._8_8_);
      local_48 = &local_58;
      local_68 = fmt::v7::to_string_view<char,_0>((char *)vargs);
      local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)&stmt_local;
      local_30 = local_48;
      local_20 = local_48;
      local_10 = local_48;
      local_18 = local_28;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_28,0,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)&local_48->string);
      format_str.size_ = (size_t)stmt_local;
      format_str.data_ = (char *)local_68.size_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_70.values_;
      fmt::v7::detail::vformat_abi_cxx11_(&local_b0,(detail *)local_68.data_,format_str,args);
      InternalException::InternalException(auVar5._0_8_,&local_b0);
      __cxa_throw(auVar5._0_8_,&InternalException::typeinfo,InternalException::~InternalException);
    }
  }
  return pSStack_88;
}

Assistant:

static Stmt* non_gen_root_parent(Stmt* stmt) {
        // this is just to get the root stmt parent that's holding given stmt
        IRNode* parent = stmt;
        uint32_t count = 0;
        while (parent->parent() && parent->parent()->ir_node_kind() == IRNodeKind::StmtKind) {
            parent = parent->parent();
            // this is to prevent infinite loop
            if (count++ > 10000) {
                throw InternalException(::format("Unable to find parent for statement"));
            }
        }
        return reinterpret_cast<Stmt*>(parent);
    }